

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O1

void AM_changeWindowLoc(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double incy;
  double incx;
  double local_58;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  double local_28;
  double local_18;
  undefined8 uStack_10;
  DAngle local_8;
  
  if ((((_ZL8m_paninc_0 != 0.0) || (NAN(_ZL8m_paninc_0))) || (_ZL8m_paninc_1 != 0.0)) ||
     (NAN(_ZL8m_paninc_1))) {
    FBaseCVar::SetGenericRep(&am_followplayer.super_FBaseCVar,(UCVarValue)0x0,CVAR_Bool);
    _ZL8f_oldloc_0 = 0x47efffffe0000000;
  }
  local_50 = ((double)(screen->super_DSimpleCanvas).super_DCanvas.Width * _ZL8m_paninc_0) / 320.0;
  local_58 = ((double)(screen->super_DSimpleCanvas).super_DCanvas.Height * _ZL8m_paninc_1) / 200.0;
  if ((am_rotate.Value == 1) ||
     ((dVar1 = m_x, dVar2 = m_y, dVar5 = local_58, dVar6 = local_50, am_rotate.Value == 2 &&
      (viewactive == true)))) {
    local_8.Degrees = *(double *)((&DAT_017e5fc8)[(long)consoleplayer * 0x54] + 0xb0) + -90.0;
    local_18 = m_x;
    uStack_10 = 0;
    local_48 = m_y;
    uStack_40 = 0;
    local_38 = local_50;
    local_28 = local_58;
    AM_rotate(&local_50,&local_58,&local_8);
    dVar1 = local_18;
    dVar2 = local_48;
    dVar5 = local_28;
    dVar6 = local_38;
  }
  m_x = local_50 + m_x;
  m_y = local_58 + m_y;
  if ((am_rotate.Value == 0) || ((am_rotate.Value == 2 && (viewactive == false)))) {
    dVar3 = m_x + m_w * 0.5;
    dVar4 = max_x;
    if ((max_x < dVar3) || (dVar4 = min_x, dVar3 < min_x)) {
      m_x = dVar4 - m_w * 0.5;
    }
    dVar3 = m_y + m_h * 0.5;
    dVar4 = max_y;
    if ((max_y < dVar3) || (dVar4 = min_y, dVar3 < min_y)) {
      m_y = dVar4 - m_h * 0.5;
    }
  }
  m_x2 = m_w + m_x;
  m_y2 = m_h + m_y;
  AM_ScrollParchment((double)(-(ulong)(dVar1 != m_x) & (ulong)dVar6),
                     (double)(-(ulong)(dVar2 != m_y) & (ulong)-dVar5));
  return;
}

Assistant:

void AM_changeWindowLoc ()
{
	if (m_paninc.x || m_paninc.y)
	{
		am_followplayer = false;
		f_oldloc.x = FLT_MAX;
	}

	double oldmx = m_x, oldmy = m_y;
	double incx, incy, oincx, oincy;
	
	incx = m_paninc.x;
	incy = m_paninc.y;

	oincx = incx = m_paninc.x * SCREENWIDTH / 320;
	oincy = incy = m_paninc.y * SCREENHEIGHT / 200;
	if (am_rotate == 1 || (am_rotate == 2 && viewactive))
	{
		AM_rotate(&incx, &incy, players[consoleplayer].camera->Angles.Yaw - 90.);
	}

	m_x += incx;
	m_y += incy;

	AM_ClipRotatedExtents (oldmx + m_w/2, oldmy + m_h/2);
	AM_ScrollParchment (m_x != oldmx ? oincx : 0, m_y != oldmy ? -oincy : 0);
}